

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_nlist__final(fct_nlist_t *list,fct_nlist_on_del_t on_del)

{
  fct_nlist_t *in_RSI;
  undefined8 *in_RDI;
  fct_nlist_on_del_t in_stack_ffffffffffffffe8;
  
  if (in_RDI != (undefined8 *)0x0) {
    fct_nlist__clear(in_RSI,in_stack_ffffffffffffffe8);
    free((void *)*in_RDI);
    return;
  }
  __assert_fail("list != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcherednik[P]libgha/src/3rd/fctx/fct.h"
                ,0x2ee,"void fct_nlist__final(fct_nlist_t *, fct_nlist_on_del_t)");
}

Assistant:

static void
fct_nlist__final(fct_nlist_t *list, fct_nlist_on_del_t on_del)
{
    FCT_ASSERT( list != NULL );
    fct_nlist__clear(list, on_del);
    free(list->itm_list);
}